

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O1

Literal * __thiscall wasm::Literal::externalize(Literal *__return_storage_ptr__,Literal *this)

{
  Type left;
  bool bVar1;
  HeapType HVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  initializer_list<wasm::Literal> init;
  Literals local_c0;
  Type local_88;
  Literal local_80;
  shared_ptr<wasm::GCData> local_68;
  shared_ptr<wasm::GCData> local_50;
  shared_ptr<wasm::GCData> local_40;
  BasicHeapType local_30;
  undefined1 local_29;
  
  left.id = (this->type).id;
  wasm::Type::Type(&local_88,(HeapType)0x2,Nullable);
  bVar1 = wasm::Type::isSubType(left,local_88);
  if (!bVar1) {
    __assert_fail("Type::isSubType(type, Type(HeapType::any, Nullable)) && \"can only externalize internal references\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                  ,0xa25,"Literal wasm::Literal::externalize() const");
  }
  bVar1 = isNull(this);
  if (bVar1) {
    local_68.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_68.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    Literal(__return_storage_ptr__,&local_68,(HeapType)0xc);
    this_00._M_pi =
         local_68.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  else {
    HVar2 = wasm::Type::getHeapType(&this->type);
    if (HVar2.id < 0xe) {
      if ((int)HVar2.id == 4) {
        local_30 = i31;
        Literal(&local_80,this);
        init._M_len = 1;
        init._M_array = &local_80;
        Literals::Literals(&local_c0,init);
        local_50.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<wasm::GCData,std::allocator<wasm::GCData>,wasm::HeapType::BasicHeapType,wasm::Literals>
                  (&local_50.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,(GCData **)&local_50,(allocator<wasm::GCData> *)&local_29,&local_30,
                   &local_c0);
        Literal(__return_storage_ptr__,&local_50,(HeapType)0x0);
        if (local_50.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
            != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_50.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
                  (&local_c0.super_SmallVector<wasm::Literal,_1UL>.flexible);
        ~Literal(local_c0.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems);
        ~Literal(&local_80);
        return __return_storage_ptr__;
      }
      if (3 < (int)HVar2.id - 7U) {
        handle_unreachable("unexpected type",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                           ,0xa36);
      }
      handle_unreachable("TODO: string literals",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                         ,0xa34);
    }
    local_40.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)(this->field_0).i64;
    local_40.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (this->field_0).gcData.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi;
    if (local_40.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_40.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_40.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_40.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_40.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    Literal(__return_storage_ptr__,&local_40,(HeapType)0x0);
    this_00._M_pi =
         local_40.super___shared_ptr<wasm::GCData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  }
  if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::externalize() const {
  assert(Type::isSubType(type, Type(HeapType::any, Nullable)) &&
         "can only externalize internal references");
  if (isNull()) {
    return Literal(std::shared_ptr<GCData>{}, HeapType::noext);
  }
  auto heapType = type.getHeapType();
  if (heapType.isBasic()) {
    switch (heapType.getBasic()) {
      case HeapType::i31: {
        return Literal(std::make_shared<GCData>(HeapType::i31, Literals{*this}),
                       HeapType::ext);
      }
      case HeapType::string:
      case HeapType::stringview_wtf8:
      case HeapType::stringview_wtf16:
      case HeapType::stringview_iter:
        WASM_UNREACHABLE("TODO: string literals");
      default:
        WASM_UNREACHABLE("unexpected type");
    }
  }
  return Literal(gcData, HeapType::ext);
}